

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool test10(void)

{
  int *piVar1;
  ostream *poVar2;
  int iVar3;
  Queue q2;
  vector<int,_std::allocator<int>_> v;
  Queue q;
  queue<int> local_78;
  _Vector_base<int,_std::allocator<int>_> local_58;
  queue<int> local_40;
  
  CP::queue<int>::queue(&local_40);
  for (iVar3 = 0; iVar3 != 350000; iVar3 = iVar3 + 7) {
    local_78.mData._0_4_ = iVar3;
    CP::queue<int>::push(&local_40,(int *)&local_78);
  }
  CP::queue<int>::to_vector((vector<int,_std::allocator<int>_> *)&local_58,&local_40,0x2904);
  CP::queue<int>::queue
            (&local_78,(iterator)(local_58._M_impl.super__Vector_impl_data._M_start + 0x7b),
             (iterator)local_58._M_impl.super__Vector_impl_data._M_finish);
  while (local_78.mSize != 0) {
    piVar1 = CP::queue<int>::front(&local_78);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar1);
    std::operator<<(poVar2," ");
    CP::queue<int>::pop(&local_78);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  CP::queue<int>::~queue(&local_78);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_58);
  CP::queue<int>::~queue(&local_40);
  return true;
}

Assistant:

bool test10() {
  Queue q;
  for (int i = 0;i < 50000;i++)
    q.push(i*7);
  vector<int> v = q.to_vector(10500);
  Queue q2(v.begin() + 123, v.end());
  while (!q2.empty()) {
    cout << q2.front() << " ";
    q2.pop();
  }
  cout << endl;
  return true;
}